

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmepoll.c
# Opt level: O0

void init_select_data(CMtrans_services_conflict svc,select_data_ptr *sdp,CManager cm)

{
  int iVar1;
  CMTransport_malloc_func p_Var2;
  undefined8 uVar3;
  select_data_ptr *in_RDX;
  CMtrans_services_conflict in_RSI;
  undefined8 *in_RDI;
  select_data_ptr sd;
  
  p_Var2 = (CMTransport_malloc_func)malloc(0x48);
  in_RSI->malloc_func = p_Var2;
  iVar1 = epoll_create(1);
  *(int *)(p_Var2 + 8) = iVar1;
  *(undefined8 *)p_Var2 = 0;
  *(undefined4 *)(p_Var2 + 0x28) = 0;
  *(undefined4 *)(p_Var2 + 0xc) = 0;
  uVar3 = (*(code *)*in_RDI)(0x18);
  *(undefined8 *)(p_Var2 + 0x10) = uVar3;
  **(undefined8 **)(p_Var2 + 0x10) = 0;
  *(undefined8 *)(*(long *)(p_Var2 + 0x10) + 8) = 0;
  *(undefined8 *)(*(long *)(p_Var2 + 0x10) + 0x10) = 0;
  uVar3 = (*(code *)*in_RDI)(0x18);
  *(undefined8 *)(p_Var2 + 0x18) = uVar3;
  **(undefined8 **)(p_Var2 + 0x18) = 0;
  *(undefined8 *)(*(long *)(p_Var2 + 0x18) + 8) = 0;
  *(undefined8 *)(*(long *)(p_Var2 + 0x18) + 0x10) = 0;
  *(undefined8 *)(p_Var2 + 0x20) = 0;
  *(undefined4 *)(p_Var2 + 0x38) = 0;
  *(undefined4 *)(p_Var2 + 0x3c) = 0xffffffff;
  *(undefined4 *)(p_Var2 + 0x40) = 0xffffffff;
  if (in_RDX != (select_data_ptr *)0x0) {
    *(select_data_ptr **)(p_Var2 + 0x30) = in_RDX;
  }
  setup_wake_mechanism(in_RSI,in_RDX);
  return;
}

Assistant:

static void
init_select_data(CMtrans_services svc, select_data_ptr *sdp, CManager cm)
{
    select_data_ptr sd = malloc(sizeof(struct select_data));
    *sdp = sd;
    sd->epfd = epoll_create(1);
    sd->server_thread =  (thr_thread_t) NULL;
    sd->closed = 0;
    sd->sel_item_max = 0;
    sd->select_items = (FunctionListElement *) svc->malloc_func(sizeof(FunctionListElement));
    sd->select_items[0].func = NULL;
    sd->select_items[0].arg1 = NULL;
    sd->select_items[0].arg2 = NULL;
    sd->write_items = (FunctionListElement *) svc->malloc_func(sizeof(FunctionListElement));
    sd->write_items[0].func = NULL;
    sd->write_items[0].arg1 = NULL;
    sd->write_items[0].arg2 = NULL;
    
    sd->periodic_task_list = NULL;
    sd->select_consistency_number = 0;
    sd->wake_read_fd = -1;
    sd->wake_write_fd = -1;
    if (cm != NULL) {
	sd->cm = cm;
    }
    setup_wake_mechanism(svc, sdp);
}